

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool handle_external_error(ParserContext *context,Token *token,match_function action)

{
  int iVar1;
  undefined1 local_f8 [4];
  wchar_t val;
  jmp_buf env;
  match_function action_local;
  Token *token_local;
  ParserContext *context_local;
  
  if ((context->stop_at_first_error & 1U) == 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)local_f8);
    ErrorList_set_local_rescue_env(context->errors,(jmp_buf_conflict *)local_f8);
    if (iVar1 == 0) {
      context_local._7_1_ = (*action)(context->token_matcher,token);
    }
    else {
      context_local._7_1_ = false;
    }
  }
  else {
    context_local._7_1_ = (*action)(context->token_matcher,token);
  }
  return context_local._7_1_;
}

Assistant:

static bool handle_external_error(ParserContext* context, Token* token, match_function action) {
    if (context->stop_at_first_error) {
        return action(context->token_matcher, token);
    }

    jmp_buf env;
    int val = setjmp(env);
    ErrorList_set_local_rescue_env(context->errors, &env);
    if (val == 0) {    
        return action(context->token_matcher, token);
    }
    return false;
}